

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::MaybeWarnCMP0074(cmMakefile *this,string *pkg)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  string *psVar4;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  byte local_282;
  string local_260;
  string local_240;
  undefined1 local_220 [8];
  ostringstream w;
  bool haveEnv;
  undefined1 local_70 [7];
  bool haveVar;
  string env;
  cmValue local_40;
  cmValue var;
  string varName;
  string *pkg_local;
  cmMakefile *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,pkg,
                 "_ROOT");
  local_40 = GetDefinition(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&var);
  std::__cxx11::string::string((string *)local_70);
  cmsys::SystemTools::GetEnv((string *)&var,(string *)local_70);
  bVar1 = cmNonempty(local_40);
  bVar2 = std::__cxx11::string::empty();
  bVar2 = (bVar2 ^ 0xff) & 1;
  if ((bVar1) || (local_282 = 0, bVar2 != 0)) {
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->WarnedCMP0074,(value_type *)&var);
    local_282 = pVar5.second;
  }
  if ((local_282 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_240,(cmPolicies *)0x4a,id);
    poVar3 = std::operator<<((ostream *)local_220,(string *)&local_240);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_240);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)local_220,"CMake variable ");
      poVar3 = std::operator<<(poVar3,(string *)&var);
      poVar3 = std::operator<<(poVar3," is set to:\n");
      poVar3 = std::operator<<(poVar3,"  ");
      psVar4 = cmValue::operator*[abi_cxx11_(&local_40);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,"\n");
    }
    if (bVar2 != 0) {
      poVar3 = std::operator<<((ostream *)local_220,"Environment variable ");
      poVar3 = std::operator<<(poVar3,(string *)&var);
      poVar3 = std::operator<<(poVar3," is set to:\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<((ostream *)local_220,"For compatibility, CMake is ignoring the variable.");
    std::__cxx11::ostringstream::str();
    IssueMessage(this,AUTHOR_WARNING,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&var);
  return;
}

Assistant:

void cmMakefile::MaybeWarnCMP0074(std::string const& pkg)
{
  // Warn if a <pkg>_ROOT variable we may use is set.
  std::string const varName = pkg + "_ROOT";
  cmValue var = this->GetDefinition(varName);
  std::string env;
  cmSystemTools::GetEnv(varName, env);

  bool const haveVar = cmNonempty(var);
  bool const haveEnv = !env.empty();
  if ((haveVar || haveEnv) && this->WarnedCMP0074.insert(varName).second) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0074) << "\n";
    if (haveVar) {
      w << "CMake variable " << varName << " is set to:\n"
        << "  " << *var << "\n";
    }
    if (haveEnv) {
      w << "Environment variable " << varName << " is set to:\n"
        << "  " << env << "\n";
    }
    w << "For compatibility, CMake is ignoring the variable.";
    this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
}